

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O0

jas_seq2d_t * jas_seq2d_copy(jas_seq2d_t *x)

{
  jas_matind_t xstart;
  jas_matind_t ystart;
  jas_matind_t xend;
  jas_matind_t yend;
  jas_matrix_t *matrix;
  jas_seqent_t jVar1;
  jas_seqent_t *pjVar2;
  long local_28;
  jas_matind_t j;
  jas_matind_t i;
  jas_matrix_t *y;
  jas_seq2d_t *x_local;
  
  xstart = jas_seq2d_xstart(x);
  ystart = jas_seq2d_ystart(x);
  xend = jas_seq2d_xend(x);
  yend = jas_seq2d_yend(x);
  matrix = jas_seq2d_create(xstart,ystart,xend,yend);
  if (matrix != (jas_matrix_t *)0x0) {
    for (j = 0; j < x->numrows_; j = j + 1) {
      for (local_28 = 0; local_28 < x->numcols_; local_28 = local_28 + 1) {
        jVar1 = jas_matrix_get(x,j,local_28);
        pjVar2 = jas_matrix_getref(matrix,j,local_28);
        *pjVar2 = jVar1;
      }
    }
    return matrix;
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                ,0xb1,"jas_seq2d_t *jas_seq2d_copy(jas_seq2d_t *)");
}

Assistant:

jas_seq2d_t *jas_seq2d_copy(jas_seq2d_t *x)
{
	jas_matrix_t *y;
	jas_matind_t i;
	jas_matind_t j;
	y = jas_seq2d_create(jas_seq2d_xstart(x), jas_seq2d_ystart(x),
	  jas_seq2d_xend(x), jas_seq2d_yend(x));
	assert(y);
	for (i = 0; i < x->numrows_; ++i) {
		for (j = 0; j < x->numcols_; ++j) {
			*jas_matrix_getref(y, i, j) = jas_matrix_get(x, i, j);
		}
	}
	return y;
}